

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock_ntop.c
# Opt level: O3

int sock_pton_with_prefix(char *cp,sockaddr *sa,int *int_prefix)

{
  addrinfo *paVar1;
  int iVar2;
  ushort **ppuVar3;
  void *pvVar4;
  char *pcVar5;
  char cVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  size_t sVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  size_t sVar14;
  char *pcVar15;
  char *__s;
  addrinfo *servinfo;
  addrinfo *local_70;
  addrinfo local_68;
  
  if (int_prefix == (int *)0x0 || (sa == (sockaddr *)0x0 || cp == (char *)0x0)) {
    return -1;
  }
  ppuVar3 = __ctype_b_loc();
  lVar8 = -(long)cp;
  uVar13 = 0;
  do {
    uVar12 = uVar13;
    uVar13 = uVar12 + 1;
  } while ((*(byte *)((long)*ppuVar3 + (long)cp[uVar12] * 2 + 1) & 0x20) != 0);
  if (cp[uVar12] != '[') {
    return -2;
  }
  pcVar15 = cp + uVar12;
  __s = cp + uVar13;
  cVar6 = '[';
  sVar14 = 0xffffffffffffffff;
  pcVar9 = __s;
  pcVar11 = (char *)0x0;
  do {
    pcVar5 = pcVar9;
    if (cVar6 != '/') {
      if (cVar6 == '\0') {
        return -2;
      }
      pcVar5 = pcVar11;
      if (cVar6 == ']') {
        if (pcVar11 == (char *)0x0) {
          pvVar4 = memchr(__s,0,sVar14);
          sVar10 = (long)pvVar4 + (lVar8 - uVar13);
          if (pvVar4 == (void *)0x0) {
            sVar10 = sVar14;
          }
          pcVar5 = (char *)malloc(sVar10 + 1);
          if (pcVar5 != (char *)0x0) {
            memcpy(pcVar5,__s,sVar10 + 1);
            pcVar5[sVar10] = '\0';
          }
          *int_prefix = 0x80;
        }
        else {
          pvVar4 = memchr(__s,0,(size_t)(pcVar11 + lVar8 + ~uVar13));
          pcVar7 = (char *)((long)pvVar4 + (lVar8 - uVar13));
          if (pvVar4 == (void *)0x0) {
            pcVar7 = pcVar11 + lVar8 + ~uVar13;
          }
          pcVar5 = (char *)malloc((size_t)(pcVar7 + 1));
          if (pcVar5 != (char *)0x0) {
            memcpy(pcVar5,__s,(size_t)(pcVar7 + 1));
            pcVar5[(long)pcVar7] = '\0';
          }
          pvVar4 = memchr(pcVar11,0,(long)pcVar15 - (long)pcVar11);
          sVar14 = (long)pvVar4 - (long)pcVar11;
          if (pvVar4 == (void *)0x0) {
            sVar14 = (long)pcVar15 - (long)pcVar11;
          }
          pcVar15 = (char *)malloc(sVar14 + 1);
          if (pcVar15 != (char *)0x0) {
            memcpy(pcVar15,pcVar11,sVar14 + 1);
            pcVar15[sVar14] = '\0';
            iVar2 = atoi(pcVar15);
            *int_prefix = iVar2;
            free(pcVar15);
          }
        }
        pcVar9 = pcVar9 + -1;
        pcVar11 = (char *)0x0;
        do {
          pcVar15 = pcVar9 + (lVar8 - uVar13);
          pcVar7 = pcVar9;
LAB_00107964:
          while( true ) {
            pcVar15 = pcVar15 + 1;
            pcVar9 = pcVar7 + 1;
            cVar6 = *pcVar9;
            if (cVar6 == ':') break;
            pcVar7 = pcVar9;
            if (cVar6 == '\0') goto LAB_001079a0;
          }
          if (pcVar11 != (char *)0x0) goto code_r0x0010797a;
          pcVar11 = pcVar7 + 2;
        } while( true );
      }
    }
    cVar6 = *pcVar9;
    pcVar9 = pcVar9 + 1;
    sVar14 = sVar14 + 1;
    pcVar15 = pcVar15 + 1;
    pcVar11 = pcVar5;
  } while( true );
code_r0x0010797a:
  pcVar7 = pcVar9;
  if (pcVar5 != (char *)0x0) goto LAB_00107964;
  pcVar5 = strdup(__s);
  pcVar11 = (char *)0x0;
LAB_001079a0:
  if (pcVar5 == (char *)0x0) {
    if (pcVar11 == (char *)0x0 || cVar6 != '\0') {
      pvVar4 = memchr(__s,0,(size_t)pcVar15);
      pcVar9 = (char *)((long)pvVar4 + (lVar8 - uVar13));
      if (pvVar4 == (void *)0x0) {
        pcVar9 = pcVar15;
      }
      pcVar5 = (char *)malloc((size_t)(pcVar9 + 1));
      if (pcVar5 != (char *)0x0) {
        memcpy(pcVar5,__s,(size_t)(pcVar9 + 1));
        pcVar5[(long)pcVar9] = '\0';
        goto LAB_00107a2c;
      }
    }
    else if (1 < (long)(pcVar11 + (lVar8 - uVar13))) {
      pcVar5 = pcp_strndup(__s,(size_t)(pcVar11 + ~uVar13 + lVar8));
      goto LAB_00107a2c;
    }
    pcVar5 = (char *)0x0;
  }
LAB_00107a2c:
  local_68.ai_addrlen = 0;
  local_68._20_4_ = 0;
  local_68.ai_addr = (sockaddr *)0x0;
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  local_68.ai_socktype = 2;
  local_68.ai_protocol = 0;
  local_68.ai_flags = 8;
  local_68.ai_family = 0;
  iVar2 = getaddrinfo(pcVar5,pcVar11,&local_68,&local_70);
  paVar1 = local_70;
  if (iVar2 != 0) {
    sock_pton_with_prefix_cold_1();
    return -2;
  }
joined_r0x00107a74:
  if (paVar1 == (addrinfo *)0x0) {
    freeaddrinfo(local_70);
    if (pcVar5 != (char *)0x0) {
LAB_00107ac8:
      free(pcVar5);
    }
LAB_00107ad0:
    if (sa->sa_family == 10) {
      if (0x80 < *int_prefix) {
        return -2;
      }
    }
    else if ((sa->sa_family == 2) && (0x20 < *int_prefix)) {
      return -2;
    }
    return 0;
  }
  if ((paVar1->ai_family | 8U) == 10) {
    sVar14 = 0x10;
    if (paVar1->ai_addr->sa_family == 10) {
      sVar14 = 0x1c;
    }
    memcpy(sa,paVar1->ai_addr,sVar14);
    if (pcVar5 != (char *)0x0) {
      freeaddrinfo(local_70);
      goto LAB_00107ac8;
    }
    if (paVar1->ai_family != 10) {
      return -2;
    }
    sa[1].sa_data[2] = '\0';
    sa[1].sa_data[3] = '\0';
    sa[1].sa_data[4] = '\0';
    sa[1].sa_data[5] = '\0';
    sa[1].sa_data[6] = '\0';
    sa[1].sa_data[7] = '\0';
    sa[1].sa_data[8] = '\0';
    sa[1].sa_data[9] = '\0';
    *(undefined8 *)(sa[1].sa_data + 10) = 0;
    sa->sa_data[6] = '\0';
    sa->sa_data[7] = '\0';
    sa->sa_data[8] = '\0';
    sa->sa_data[9] = '\0';
    sa->sa_data[10] = '\0';
    sa->sa_data[0xb] = '\0';
    sa->sa_data[0xc] = '\0';
    sa->sa_data[0xd] = '\0';
    sa[1].sa_family = 0;
    sa[1].sa_data[0] = '\0';
    sa[1].sa_data[1] = '\0';
    sa[1].sa_data[2] = '\0';
    sa[1].sa_data[3] = '\0';
    sa[1].sa_data[4] = '\0';
    sa[1].sa_data[5] = '\0';
    freeaddrinfo(local_70);
    goto LAB_00107ad0;
  }
  paVar1 = paVar1->ai_next;
  goto joined_r0x00107a74;
}

Assistant:

int sock_pton_with_prefix(const char *cp, struct sockaddr *sa,
                          int *int_prefix) {
    const char *prefix_begin = NULL;
    char *prefix = NULL;

    const char *ip_end;
    char *host_name = NULL;
    const char *port = NULL;

    if ((!cp) || (!sa) || (!int_prefix)) {
        return -1;
    }

    // skip ws
    while ((cp) && (isspace(*cp))) {
        ++cp;
    }

    ip_end = cp;
    if (*cp == '[') { // find matching bracket ']'
        ++cp;
        while ((*ip_end) && (*ip_end != ']')) {
            if (*ip_end == '/') {
                prefix_begin = ip_end + 1;
            }
            ++ip_end;
        }

        if (!*ip_end) {
            return -2;
        }

        if (prefix_begin) {
            host_name = strndup(cp, prefix_begin - cp - 1);
            prefix = strndup(prefix_begin, ip_end - prefix_begin);
            if (prefix) {
                *int_prefix = atoi(prefix);
                free(prefix);
            }
        } else {
            host_name = strndup(cp, ip_end - cp);
            *int_prefix = 128;
        }
        ++ip_end;
    } else {
        return -2;
    }

    { // find start of port part
        while (*ip_end) {
            if (*ip_end == ':') {
                if (!port) {
                    port = ip_end + 1;
                } else if (host_name == NULL) { // means addr has [] block
                    port = NULL; // more than 1 ":" => assume the whole addr is
                                 // IPv6 address w/o port
                    host_name = strdup(cp);
                    break;
                }
            }
            ++ip_end;
        }
        if (!host_name) {
            if ((*ip_end == 0) && (port != NULL)) {
                if (port - cp > 1) { // only port entered
                    host_name = strndup(cp, port - cp - 1);
                }
            } else {
                host_name = strndup(cp, ip_end - cp);
            }
        }
    }

    // getaddrinfo for host
    {
        struct addrinfo hints, *servinfo, *p;
        int rv;

        memset(&hints, 0, sizeof hints);
        hints.ai_family = AF_UNSPEC;
        hints.ai_socktype = SOCK_DGRAM;
        hints.ai_flags = AI_V4MAPPED;

        if ((rv = getaddrinfo(host_name, port, &hints, &servinfo)) != 0) {
            fprintf(stderr, "getaddrinfo: %s\n", gai_strerror(rv));
            if (host_name)
                free(host_name);
            return -2;
        }

        for (p = servinfo; p != NULL; p = p->ai_next) {
            if ((p->ai_family == AF_INET) || (p->ai_family == AF_INET6)) {
                memcpy(sa, p->ai_addr, SA_LEN(p->ai_addr));
                if (host_name == NULL) { // getaddrinfo returns localhost ip if
                                         // hostname is null
                    switch (p->ai_family) {
                    case AF_INET6:
                        memset(&((struct sockaddr_in6 *)sa)->sin6_addr, 0,
                               sizeof(struct sockaddr_in6));
                        break;
                    default: // Should never happen LCOV_EXCL_START
                        if (host_name)
                            free(host_name);
                        return -2;
                    } // LCOV_EXCL_STOP
                }
                break;
            }
        }
        freeaddrinfo(servinfo);
    }

    if (host_name)
        free(host_name);

    if ((sa->sa_family == AF_INET) && (*int_prefix > 32)) {

        return -2;
    }

    if ((sa->sa_family == AF_INET6) && (*int_prefix > 128)) {

        return -2;
    }

    return 0;
}